

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdflib.cpp
# Opt level: O3

void E0000(int IENTRY,int *status,double *x,double *fx,unsigned_long *qleft,unsigned_long *qhi,
          double *zabsst,double *zabsto,double *zbig,double *zrelst,double *zrelto,double *zsmall,
          double *zstpmu)

{
  double dVar1;
  double dVar2;
  int iVar3;
  unsigned_long uVar4;
  undefined8 extraout_RAX;
  bool bVar5;
  double dVar6;
  string local_38;
  
  uVar4 = E0000::qincr;
  dVar2 = E0000::xsave;
  dVar1 = E0000::small;
  dVar6 = E0000::big;
  if (IENTRY == 1) {
    E0000::absstp = *zabsst;
    E0000::abstol = *zabsto;
    E0000::big = *zbig;
    E0000::relstp = *zrelst;
    E0000::reltol = *zrelto;
    E0000::small = *zsmall;
    E0000::stpmul = *zstpmu;
    return;
  }
  if (*status < 1) {
    dVar6 = *x;
    if ((dVar6 < E0000::small) || (E0000::big < dVar6)) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38," SMALL, X, BIG not monotone in INVR","");
      ftnstop(&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(extraout_RAX);
    }
    E0000::xsave = dVar6;
    *x = E0000::small;
    iVar3 = 1;
    goto LAB_001b943f;
  }
  switch(E0000::i99999) {
  case 1:
    E0000::fsmall = *fx;
    *x = E0000::big;
    iVar3 = 2;
    break;
  case 2:
    dVar6 = *fx;
    E0000::qincr = (unsigned_long)(E0000::fsmall < dVar6);
    if (E0000::fsmall < dVar6) {
      if (0.0 < E0000::fsmall) {
        *status = -1;
        uVar4 = 1;
LAB_001b973e:
        *qhi = uVar4;
        *qleft = uVar4;
        return;
      }
      if (dVar6 < 0.0) {
        *status = -1;
        uVar4 = 0;
        goto LAB_001b973e;
      }
    }
    else {
      if (E0000::fsmall < 0.0) {
        *status = -1;
        *qleft = 1;
        *qhi = 0;
        return;
      }
      if (0.0 < dVar6) {
        *status = -1;
        *qleft = 0;
        *qhi = 1;
        return;
      }
    }
    *x = E0000::xsave;
    E0000::step = ABS(dVar2) * E0000::relstp;
    if (ABS(dVar2) * E0000::relstp <= E0000::absstp) {
      E0000::step = E0000::absstp;
    }
    iVar3 = 3;
    break;
  case 3:
    dVar6 = *fx;
    if ((dVar6 == 0.0) && (!NAN(dVar6))) goto LAB_001b96ca;
    bVar5 = 0.0 <= dVar6;
    if (E0000::qincr == 0) {
      bVar5 = dVar6 <= 0.0;
    }
    if (!bVar5) {
      E0000::xlb = E0000::xsave;
      E0000::xub = E0000::xsave + E0000::step;
      if (E0000::big <= E0000::xsave + E0000::step) {
        E0000::xub = E0000::big;
      }
      goto LAB_001b97b7;
    }
    E0000::xub = E0000::xsave;
    E0000::xlb = E0000::small;
    if (E0000::small <= E0000::xsave - E0000::step) {
      E0000::xlb = E0000::xsave - E0000::step;
    }
    goto LAB_001b9525;
  case 4:
    bVar5 = 0.0 <= *fx;
    if (E0000::qincr == 0) {
      bVar5 = *fx <= 0.0;
    }
    if ((bVar5) || (E0000::big <= E0000::xub)) {
      if (!(bool)(bVar5 | E0000::xub < E0000::big)) {
        bVar5 = E0000::qincr == 0;
        *status = -1;
        *qleft = 0;
        *qhi = (ulong)bVar5;
        *x = dVar6;
        return;
      }
LAB_001b9637:
      E0001::xxlo = E0000::xlb;
      E0001::xxhi = E0000::xub;
      E0001::abstol = E0000::abstol;
      E0001::reltol = E0000::reltol;
      *status = 0;
LAB_001b966d:
      E0001(0,status,x,fx,&E0000::xlo,&E0000::xhi,&E0000::qdum1,&E0000::qdum2,(double *)0x0,
            (double *)0x0,(double *)0x0,(double *)0x0);
      iVar3 = 6;
      if (*status != 1) goto LAB_001b96bd;
    }
    else {
      E0000::step = E0000::stpmul * E0000::step;
      E0000::xlb = E0000::xub;
      E0000::xub = E0000::step + E0000::xub;
      if (E0000::big <= E0000::xub) {
        E0000::xub = E0000::big;
      }
LAB_001b97b7:
      *x = E0000::xub;
      iVar3 = 4;
    }
    break;
  case 5:
    bVar5 = *fx <= 0.0;
    if (E0000::qincr == 0) {
      bVar5 = 0.0 <= *fx;
    }
    if ((bVar5) || (E0000::xlb <= E0000::small)) {
      if (!(bool)(bVar5 | E0000::small < E0000::xlb)) {
        *status = -1;
        *qleft = 1;
        *qhi = uVar4;
        *x = dVar1;
        return;
      }
      goto LAB_001b9637;
    }
    E0000::step = E0000::stpmul * E0000::step;
    E0000::xub = E0000::xlb;
    dVar6 = E0000::xlb - E0000::step;
    E0000::xlb = E0000::small;
    if (E0000::small <= dVar6) {
      E0000::xlb = dVar6;
    }
LAB_001b9525:
    *x = E0000::xlb;
    iVar3 = 5;
    break;
  case 6:
    if (*status == 1) goto LAB_001b966d;
LAB_001b96bd:
    *x = E0000::xlo;
LAB_001b96ca:
    *status = 0;
  default:
    goto switchD_001b93e2_default;
  }
LAB_001b943f:
  E0000::i99999 = iVar3;
  *status = 1;
switchD_001b93e2_default:
  return;
}

Assistant:

void E0000 ( int IENTRY, int *status, double *x, double *fx,
  unsigned long *qleft, unsigned long *qhi, double *zabsst,
  double *zabsto, double *zbig, double *zrelst,
  double *zrelto, double *zsmall, double *zstpmu )

//****************************************************************************80
//
//  Purpose:
//
//    E0000 is a reverse-communication zero bounder.
//
{
# define qxmon(zx,zy,zz) int((zx) <= (zy) && (zy) <= (zz))

  static double absstp;
  static double abstol;
  static double big,fbig,fsmall,relstp,reltol,small,step,stpmul,xhi,
    xlb,xlo,xsave,xub,yy;
  static int i99999;
  static unsigned long qbdd,qcond,qdum1,qdum2,qincr,qlim,qup;
    switch(IENTRY){case 0: goto DINVR; case 1: goto DSTINV;}
DINVR:
    if(*status > 0) goto S310;
    qcond = !qxmon(small,*x,big);
    if(qcond) 
    {
      ftnstop(" SMALL, X, BIG not monotone in INVR");
    }
    xsave = *x;
//
//     See that SMALL and BIG bound the zero and set QINCR
//
    *x = small;
//
//     GET-FUNCTION-VALUE
//
    i99999 = 1;
    goto S300;
S10:
    fsmall = *fx;
    *x = big;
//
//     GET-FUNCTION-VALUE
//
    i99999 = 2;
    goto S300;
S20:
    fbig = *fx;
    qincr = fbig > fsmall;
    if(!qincr) goto S50;
    if(fsmall <= 0.0e0) goto S30;
    *status = -1;
    *qleft = *qhi = 1;
    return;
S30:
    if(fbig >= 0.0e0) goto S40;
    *status = -1;
    *qleft = *qhi = 0;
    return;
S40:
    goto S80;
S50:
    if(fsmall >= 0.0e0) goto S60;
    *status = -1;
    *qleft = 1;
    *qhi = 0;
    return;
S60:
    if(fbig <= 0.0e0) goto S70;
    *status = -1;
    *qleft = 0;
    *qhi = 1;
    return;
S80:
S70:
    *x = xsave;
    step = fifdmax1(absstp,relstp*fabs(*x));
//
//      YY = F(X) - Y
//     GET-FUNCTION-VALUE
//
    i99999 = 3;
    goto S300;
S90:
    yy = *fx;
    if(!(yy == 0.0e0)) goto S100;
    *status = 0;
    return;
S100:
    qup = (qincr && yy < 0.0e0) || (!qincr && yy > 0.0e0);
//
//     HANDLE CASE IN WHICH WE MUST STEP HIGHER
//
    if(!qup) goto S170;
    xlb = xsave;
    xub = fifdmin1(xlb+step,big);
    goto S120;
S110:
    if(qcond) goto S150;
S120:
//
//      YY = F(XUB) - Y
//
    *x = xub;
//
//     GET-FUNCTION-VALUE
//
    i99999 = 4;
    goto S300;
S130:
    yy = *fx;
    qbdd = (qincr && yy >= 0.0e0) || (!qincr && yy <= 0.0e0);
    qlim = xub >= big;
    qcond = qbdd || qlim;
    if(qcond) goto S140;
    step = stpmul*step;
    xlb = xub;
    xub = fifdmin1(xlb+step,big);
S140:
    goto S110;
S150:
    if(!(qlim && !qbdd)) goto S160;
    *status = -1;
    *qleft = 0;
    *qhi = !qincr;
    *x = big;
    return;
S160:
    goto S240;
S170:
//
//     HANDLE CASE IN WHICH WE MUST STEP LOWER
//
    xub = xsave;
    xlb = fifdmax1(xub-step,small);
    goto S190;
S180:
    if(qcond) goto S220;
S190:
//
//      YY = F(XLB) - Y
//
    *x = xlb;
//
//     GET-FUNCTION-VALUE
//
    i99999 = 5;
    goto S300;
S200:
    yy = *fx;
    qbdd = (qincr && yy <= 0.0e0) || (!qincr && yy >= 0.0e0);
    qlim = xlb <= small;
    qcond = qbdd || qlim;
    if(qcond) goto S210;
    step = stpmul*step;
    xub = xlb;
    xlb = fifdmax1(xub-step,small);
S210:
    goto S180;
S220:
    if(!(qlim && !qbdd)) goto S230;
    *status = -1;
    *qleft = 1;
    *qhi = qincr;
    *x = small;
    return;
S240:
S230:
    dstzr(&xlb,&xub,&abstol,&reltol);
//
//  IF WE REACH HERE, XLB AND XUB BOUND THE ZERO OF F.
//
    *status = 0;
    goto S260;
S250:
    if(!(*status == 1)) goto S290;
S260:
    dzror ( status, x, fx, &xlo, &xhi, &qdum1, &qdum2 );
    if(!(*status == 1)) goto S280;
//
//     GET-FUNCTION-VALUE
//
    i99999 = 6;
    goto S300;
S280:
S270:
    goto S250;
S290:
    *x = xlo;
    *status = 0;
    return;
DSTINV:
    small = *zsmall;
    big = *zbig;
    absstp = *zabsst;
    relstp = *zrelst;
    stpmul = *zstpmu;
    abstol = *zabsto;
    reltol = *zrelto;
    return;
S300:
//
//     TO GET-FUNCTION-VALUE
//
    *status = 1;
    return;
S310:
    switch(int(i99999)){case 1: goto S10;case 2: goto S20;case 3: goto S90;case
      4: goto S130;case 5: goto S200;case 6: goto S270;default: break;}
# undef qxmon
}